

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
BuildingInfoIRCCommand::trigger
          (BuildingInfoIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  int iVar1;
  long *plVar2;
  undefined4 uVar3;
  char cVar4;
  long lVar5;
  size_type sVar6;
  _Fwd_list_node_base _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *pcVar9;
  size_t sVar10;
  bool bVar11;
  long *plVar12;
  undefined4 uVar13;
  long *plVar14;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nStrings;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gStrings;
  string str;
  _Fwd_list_impl local_a0;
  _Fwd_list_impl local_98;
  _Fwd_list_impl local_90;
  _Fwd_list_impl local_88;
  undefined4 local_80;
  undefined4 local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58;
  long *local_50;
  long *local_48;
  long local_40;
  long *local_38;
  
  pcVar9 = channel._M_str;
  sVar10 = channel._M_len;
  lVar5 = Jupiter::IRC::Client::getChannel(source,sVar10,pcVar9,pcVar9,nick._M_len,nick._M_str);
  if (lVar5 != 0) {
    local_80 = Jupiter::IRC::Client::Channel::getType();
    local_88._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
    local_90._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
    local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
    local_a0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
    RenX::getCore();
    RenX::Core::getServers();
    local_38 = local_48;
    bVar11 = false;
    plVar14 = local_50;
    if (local_50 != local_48) {
      do {
        cVar4 = RenX::Server::isLogChanType((int)*plVar14);
        if (cVar4 != '\0') {
          plVar12 = *(long **)(*plVar14 + 0x28);
          plVar2 = *(long **)(*plVar14 + 0x30);
          local_58 = plVar14;
          if (plVar12 != plVar2) {
            uVar13 = 0;
            do {
              sVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)*plVar12,"Rx_Building_Air",0,0xf);
              uVar3 = (int)CONCAT71((int7)(sVar6 >> 8),1);
              if ((sVar6 == 0 & (byte)uVar13) == 0) {
                local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                local_7c = uVar13;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_78,pluginInstance.m_buildingInfoFormat._M_dataplus._M_p,
                           pluginInstance.m_buildingInfoFormat._M_dataplus._M_p +
                           pluginInstance.m_buildingInfoFormat._M_string_length);
                RenX::processTags((string *)&local_78,(Server *)*local_58,(PlayerInfo *)0x0,
                                  (PlayerInfo *)0x0,(BuildingInfo *)*plVar12);
                uVar13 = local_7c;
                if (*(char *)(*plVar12 + 0x34) == '\x01') {
                  _Var7._M_next =
                       &std::
                        _Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        _M_create_node<std::__cxx11::string_const&>
                                  ((_Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&local_a0,&local_78)->super__Fwd_list_node_base;
                  ((_Fwd_list_node_base *)&(_Var7._M_next)->_M_next)->_M_next =
                       (_Fwd_list_node_base *)local_a0._M_head._M_next;
                  local_a0._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)_Var7._M_next
                  ;
                }
                else {
                  iVar1 = *(int *)(*plVar12 + 0x20);
                  if (iVar1 == 1) {
                    _Var7._M_next =
                         &std::
                          _Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                          ::_M_create_node<std::__cxx11::string_const&>
                                    ((_Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&local_90,&local_78)->super__Fwd_list_node_base;
                    ((_Fwd_list_node_base *)&(_Var7._M_next)->_M_next)->_M_next =
                         (_Fwd_list_node_base *)local_90._M_head._M_next;
                    local_90._M_head._M_next =
                         (_Fwd_list_node_base)(_Fwd_list_node_base)_Var7._M_next;
                  }
                  else if (iVar1 == 0) {
                    _Var7._M_next =
                         &std::
                          _Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                          ::_M_create_node<std::__cxx11::string_const&>
                                    ((_Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&local_88,&local_78)->super__Fwd_list_node_base;
                    ((_Fwd_list_node_base *)&(_Var7._M_next)->_M_next)->_M_next =
                         (_Fwd_list_node_base *)local_88._M_head._M_next;
                    local_88._M_head._M_next =
                         (_Fwd_list_node_base)(_Fwd_list_node_base)_Var7._M_next;
                  }
                  else {
                    _Var7._M_next =
                         &std::
                          _Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                          ::_M_create_node<std::__cxx11::string_const&>
                                    ((_Fwd_list_base<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&local_98,&local_78)->super__Fwd_list_node_base;
                    ((_Fwd_list_node_base *)&(_Var7._M_next)->_M_next)->_M_next =
                         (_Fwd_list_node_base *)local_98._M_head._M_next;
                    local_98._M_head._M_next =
                         (_Fwd_list_node_base)(_Fwd_list_node_base)_Var7._M_next;
                  }
                }
                paVar8 = &local_78.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != paVar8) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                  paVar8 = extraout_RAX;
                }
                uVar3 = (int)CONCAT71((int7)((ulong)paVar8 >> 8),sVar6 == 0 | (byte)uVar13);
              }
              uVar13 = uVar3;
              plVar12 = plVar12 + 1;
            } while (plVar12 != plVar2);
          }
          while (local_88._M_head._M_next != (_Fwd_list_node_base *)0x0) {
            std::
            _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase_after((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_88,&local_88._M_head);
            Jupiter::IRC::Client::sendMessage
                      (source,sVar10,pcVar9,*(undefined8 *)((long)local_88._M_head._M_next + 0x10),
                       (((__aligned_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)local_88._M_head._M_next + 8))->_M_storage).__align);
          }
          while (local_90._M_head._M_next != (_Fwd_list_node_base *)0x0) {
            std::
            _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase_after((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_90,&local_90._M_head);
            Jupiter::IRC::Client::sendMessage
                      (source,sVar10,pcVar9,*(undefined8 *)((long)local_90._M_head._M_next + 0x10),
                       (((__aligned_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)local_90._M_head._M_next + 8))->_M_storage).__align);
          }
          while (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
            std::
            _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase_after((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_98,&local_98._M_head);
            Jupiter::IRC::Client::sendMessage
                      (source,sVar10,pcVar9,*(undefined8 *)((long)local_98._M_head._M_next + 0x10),
                       (((__aligned_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)local_98._M_head._M_next + 8))->_M_storage).__align);
          }
          while (local_a0._M_head._M_next != (_Fwd_list_node_base *)0x0) {
            std::
            _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase_after((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_a0,&local_a0._M_head);
            Jupiter::IRC::Client::sendMessage
                      (source,sVar10,pcVar9,*(undefined8 *)((long)local_a0._M_head._M_next + 0x10),
                       (((__aligned_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)local_a0._M_head._M_next + 8))->_M_storage).__align);
          }
          bVar11 = true;
          plVar14 = local_58;
        }
        plVar14 = plVar14 + 1;
      } while (plVar14 != local_38);
    }
    if (local_50 != (long *)0x0) {
      operator_delete(local_50,local_40 - (long)local_50);
    }
    if (!bVar11) {
      Jupiter::IRC::Client::sendMessage
                (source,sVar10,pcVar9,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
    std::
    _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_a0);
    std::
    _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_98);
    std::
    _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_90);
    std::
    _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_88);
  }
  return;
}

Assistant:

void BuildingInfoIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	int type = chan->getType();
	bool seenStrip;
	bool foundServer{};
	std::forward_list<std::string> gStrings;
	std::forward_list<std::string> nStrings;
	std::forward_list<std::string> oStrings;
	std::forward_list<std::string> cStrings;
	for (const auto& server : RenX::getCore()->getServers()) {
		if (server->isLogChanType(type)) {
			foundServer = true;
			seenStrip = false;
			for (const auto& building : server->buildings){
				if (building->name.find("Rx_Building_Air"sv) == 0) {
					if (seenStrip) {
						continue;
					}

					seenStrip = true;
				}
				std::string str(pluginInstance.getBuildingInfoFormat());
				RenX::processTags(str, server, nullptr, nullptr, building.get());

				if (building->capturable)
					cStrings.push_front(str);
				else if (building->team == RenX::TeamType::GDI)
					gStrings.push_front(str);
				else if (building->team == RenX::TeamType::Nod)
					nStrings.push_front(str);
				else
					oStrings.push_front(str);
			}

			while (gStrings.empty() == false) {
				gStrings.pop_front();
				source->sendMessage(channel, gStrings.front());
			}
			while (nStrings.empty() == false) {
				nStrings.pop_front();
				source->sendMessage(channel, nStrings.front());
			}
			while (oStrings.empty() == false) {
				oStrings.pop_front();
				source->sendMessage(channel, oStrings.front());
			}
			while (cStrings.empty() == false) {
				cStrings.pop_front();
				source->sendMessage(channel, cStrings.front());
			}
		}
	}

	if (!foundServer) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}